

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult ChangeDirectory(ShellState *state,char **azArg,idx_t nArg)

{
  int iVar1;
  
  if (safe_mode == '\x01') {
    fwrite(".cd cannot be used in -safe mode\n",0x21,1,_stderr);
  }
  else {
    iVar1 = chdir(azArg[1]);
    if (iVar1 == 0) {
      return SUCCESS;
    }
    fprintf(_stderr,"Cannot change to directory \"%s\"\n",azArg[1]);
  }
  return FAIL;
}

Assistant:

MetadataResult ChangeDirectory(ShellState &state, const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".cd cannot be used in -safe mode\n");
		return MetadataResult::FAIL;
	}
	int rc;
#if defined(_WIN32) || defined(WIN32)
	wchar_t *z = sqlite3_win32_utf8_to_unicode(azArg[1]);
	rc = !SetCurrentDirectoryW(z);
	sqlite3_free(z);
#else
	rc = chdir(azArg[1]);
#endif
	if (rc) {
		utf8_printf(stderr, "Cannot change to directory \"%s\"\n", azArg[1]);
		return MetadataResult::FAIL;
	}
	return MetadataResult::SUCCESS;
}